

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status __thiscall leveldb::BlockHandle::DecodeFrom(BlockHandle *this,Slice *input)

{
  bool bVar1;
  Slice *in_RDX;
  Slice local_40;
  Slice local_30;
  Slice *local_20;
  Slice *input_local;
  BlockHandle *this_local;
  
  local_20 = in_RDX;
  input_local = input;
  this_local = this;
  bVar1 = GetVarint64(in_RDX,(uint64_t *)input);
  if ((bVar1) && (bVar1 = GetVarint64(local_20,&input->size_), bVar1)) {
    Status::OK();
  }
  else {
    Slice::Slice(&local_30,"bad block handle");
    Slice::Slice(&local_40);
    Status::Corruption((Status *)this,&local_30,&local_40);
  }
  return (Status)(char *)this;
}

Assistant:

Status BlockHandle::DecodeFrom(Slice* input) {
  if (GetVarint64(input, &offset_) && GetVarint64(input, &size_)) {
    return Status::OK();
  } else {
    return Status::Corruption("bad block handle");
  }
}